

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

_Bool Curl_sasl_can_authenticate(SASL *sasl,Curl_easy *data)

{
  Curl_easy *data_local;
  SASL *sasl_local;
  
  if ((data->state).aptr.user == (char *)0x0) {
    if ((sasl->authmechs & sasl->prefmech & 0x20) == 0) {
      sasl_local._7_1_ = false;
    }
    else {
      sasl_local._7_1_ = true;
    }
  }
  else {
    sasl_local._7_1_ = true;
  }
  return sasl_local._7_1_;
}

Assistant:

bool Curl_sasl_can_authenticate(struct SASL *sasl, struct Curl_easy *data)
{
  /* Have credentials been provided? */
  if(data->state.aptr.user)
    return TRUE;

  /* EXTERNAL can authenticate without a username and/or password */
  if(sasl->authmechs & sasl->prefmech & SASL_MECH_EXTERNAL)
    return TRUE;

  return FALSE;
}